

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O3

size_t HTS_fread(void *buf,size_t size,size_t n,HTS_File *fp)

{
  long *plVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (((n != 0) && (size != 0)) && (fp != (HTS_File *)0x0)) {
    if (fp->type == '\x01') {
      uVar5 = n * size;
      if (uVar5 != 0) {
        plVar1 = (long *)fp->pointer;
        uVar4 = 0;
        do {
          uVar2 = plVar1[2];
          if ((ulong)plVar1[1] <= uVar2) {
            uVar5 = uVar4;
            if (uVar4 == 0) {
              return 0;
            }
            break;
          }
          plVar1[2] = uVar2 + 1;
          *(undefined1 *)((long)buf + uVar4) = *(undefined1 *)(*plVar1 + uVar2);
          uVar4 = uVar4 + 1;
        } while (uVar5 - uVar4 != 0);
        return uVar5 / size;
      }
    }
    else {
      if (fp->type == '\0') {
        sVar3 = fread(buf,size,n,(FILE *)fp->pointer);
        return sVar3;
      }
      HTS_fread_cold_1();
    }
  }
  return 0;
}

Assistant:

static size_t HTS_fread(void *buf, size_t size, size_t n, HTS_File * fp)
{
   if (fp == NULL || size == 0 || n == 0) {
      return 0;
   }
   if (fp->type == HTS_FILE) {
      return fread(buf, size, n, (FILE *) fp->pointer);
   } else if (fp->type == HTS_DATA) {
      HTS_Data *d = (HTS_Data *) fp->pointer;
      size_t i, length = size * n;
      unsigned char *c = (unsigned char *) buf;
      for (i = 0; i < length; i++) {
         if (d->index < d->size)
            c[i] = d->data[d->index++];
         else
            break;
      }
      if (i == 0)
         return 0;
      else
         return i / size;
   }
   HTS_error(0, "HTS_fread: Unknown file type.\n");
   return 0;
}